

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example.cpp
# Opt level: O0

int main(void)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  char *pcVar4;
  int code;
  uint64_t test_time;
  string local_378 [8];
  string totp_key;
  hmac local_350 [7];
  bool valid_fp;
  string timed_token;
  allocator local_329;
  string local_328 [8];
  string fingerprint;
  allocator local_301;
  string local_300 [39];
  byte local_2d9;
  hmac local_2d8 [7];
  bool valid;
  string time_token;
  allocator local_2b1;
  string local_2b0 [32];
  hmac local_290 [8];
  string hmac_sha512_upper;
  allocator local_269;
  string local_268 [32];
  hmac local_248 [8];
  string hmac_sha512;
  allocator local_221;
  string local_220 [32];
  hmac local_200 [8];
  string hmac_sha256;
  allocator local_1d9;
  string local_1d8 [39];
  allocator local_1b1;
  string local_1b0 [32];
  hmac local_190 [8];
  string hex_output;
  allocator local_169;
  string local_168 [32];
  hmac_hash local_148 [8];
  string sha512_output;
  allocator local_121;
  string local_120 [32];
  hmac_hash local_100 [8];
  string sha256_output;
  allocator local_d9;
  string local_d8 [32];
  string local_b8 [8];
  string sha1_output;
  allocator local_91;
  string local_90 [39];
  allocator local_69;
  string local_68 [8];
  string key;
  allocator local_31;
  string local_30 [8];
  string input;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"grape",&local_31);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_68,"12345",&local_69);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_90,"SHA1",&local_91);
  print_section((string *)local_90);
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  hmac_hash::sha1(local_b8);
  poVar3 = std::operator<<((ostream *)&std::cout,"sha1(\'");
  poVar3 = std::operator<<(poVar3,local_30);
  poVar3 = std::operator<<(poVar3,"\') = ");
  poVar3 = std::operator<<(poVar3,(string *)local_b8);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  std::operator<<((ostream *)&std::cout,"Expected: bc8a2f8cdedb005b5c787692853709b060db75ff\n\n");
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d8,"SHA256",&local_d9);
  print_section((string *)local_d8);
  std::__cxx11::string::~string(local_d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_d9);
  hmac_hash::sha256(local_100,(string *)local_30);
  poVar3 = std::operator<<((ostream *)&std::cout,"sha256(\'");
  poVar3 = std::operator<<(poVar3,local_30);
  poVar3 = std::operator<<(poVar3,"\') = ");
  poVar3 = std::operator<<(poVar3,(string *)local_100);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  std::operator<<((ostream *)&std::cout,
                  "Expected: 0f78fcc486f5315418fbf095e71c0675ee07d318e5ac4d150050cd8e57966496\n\n");
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_120,"SHA512",&local_121);
  print_section((string *)local_120);
  std::__cxx11::string::~string(local_120);
  std::allocator<char>::~allocator((allocator<char> *)&local_121);
  hmac_hash::sha512(local_148,(string *)local_30);
  poVar3 = std::operator<<((ostream *)&std::cout,"sha512(\'");
  poVar3 = std::operator<<(poVar3,local_30);
  poVar3 = std::operator<<(poVar3,"\') = ");
  poVar3 = std::operator<<(poVar3,(string *)local_148);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  std::operator<<((ostream *)&std::cout,
                  "Expected: 9375d1abdb644a01955bccad12e2f5c2bd8a3e226187e548d99c559a99461453b980123746753d07c169c22a5d9cc75cb158f0e8d8c0e713559775b5e1391fc4\n\n"
                 );
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_168,"to_hex",&local_169);
  print_section((string *)local_168);
  std::__cxx11::string::~string(local_168);
  std::allocator<char>::~allocator((allocator<char> *)&local_169);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1b0,"012345",&local_1b1);
  hmac::to_hex(local_190,(string *)local_1b0,false);
  std::__cxx11::string::~string(local_1b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1b1);
  poVar3 = std::operator<<((ostream *)&std::cout,"to_hex(\"012345\") = ");
  poVar3 = std::operator<<(poVar3,(string *)local_190);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1d8,"HMAC-SHA256",&local_1d9);
  print_section((string *)local_1d8);
  std::__cxx11::string::~string(local_1d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1d9);
  hmac::get_hmac(local_200,(string *)local_68,(string *)local_30,SHA256,true,false);
  poVar3 = std::operator<<((ostream *)&std::cout,"HMAC(\'");
  poVar3 = std::operator<<(poVar3,local_68);
  poVar3 = std::operator<<(poVar3,"\', \'");
  poVar3 = std::operator<<(poVar3,local_30);
  poVar3 = std::operator<<(poVar3,"\', SHA256) = ");
  poVar3 = std::operator<<(poVar3,(string *)local_200);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  std::operator<<((ostream *)&std::cout,
                  "Expected: 7632ac2e8ddedaf4b3e7ab195fefd17571c37c970e02e169195a158ef59e53ca\n\n");
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_220,"HMAC-SHA512",&local_221);
  print_section((string *)local_220);
  std::__cxx11::string::~string(local_220);
  std::allocator<char>::~allocator((allocator<char> *)&local_221);
  hmac::get_hmac(local_248,(string *)local_68,(string *)local_30,SHA512,true,false);
  poVar3 = std::operator<<((ostream *)&std::cout,"HMAC(\'");
  poVar3 = std::operator<<(poVar3,local_68);
  poVar3 = std::operator<<(poVar3,"\', \'");
  poVar3 = std::operator<<(poVar3,local_30);
  poVar3 = std::operator<<(poVar3,"\', SHA512) = ");
  poVar3 = std::operator<<(poVar3,(string *)local_248);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  std::operator<<((ostream *)&std::cout,
                  "Expected: c54ddf9647a949d0df925a1c1f8ba1c9d721a671c396fde1062a71f9f7ffae5dc10f6be15be63bb0363d051365e23f890368c54828497b9aef2eb2fc65b633e6\n\n"
                 );
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_268,"HMAC-SHA512 (uppercase)",&local_269);
  print_section((string *)local_268);
  std::__cxx11::string::~string(local_268);
  std::allocator<char>::~allocator((allocator<char> *)&local_269);
  hmac::get_hmac(local_290,(string *)local_68,(string *)local_30,SHA512,true,true);
  poVar3 = std::operator<<((ostream *)&std::cout,"HMAC(\'");
  poVar3 = std::operator<<(poVar3,local_68);
  poVar3 = std::operator<<(poVar3,"\', \'");
  poVar3 = std::operator<<(poVar3,local_30);
  poVar3 = std::operator<<(poVar3,"\', SHA512, hex=true, upper=true) = ");
  poVar3 = std::operator<<(poVar3,(string *)local_290);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2b0,"HMAC-TIMED TOKEN",&local_2b1);
  print_section((string *)local_2b0);
  std::__cxx11::string::~string(local_2b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2b1);
  hmac::generate_time_token(local_2d8,(string *)local_68,0x3c,SHA256);
  poVar3 = std::operator<<((ostream *)&std::cout,"Time token (now) = ");
  poVar3 = std::operator<<(poVar3,(string *)local_2d8);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  local_2d9 = hmac::is_token_valid((string *)local_2d8,(string *)local_68,0x3c,SHA256);
  poVar3 = std::operator<<((ostream *)&std::cout,"Token valid? = ");
  pcVar4 = "NO";
  if ((local_2d9 & 1) != 0) {
    pcVar4 = "YES";
  }
  poVar3 = std::operator<<(poVar3,pcVar4);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_300,"HMAC-TIMED TOKEN (with fingerprint)",&local_301);
  print_section((string *)local_300);
  std::__cxx11::string::~string(local_300);
  std::allocator<char>::~allocator((allocator<char> *)&local_301);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_328,"my-client-unique-id",&local_329);
  std::allocator<char>::~allocator((allocator<char> *)&local_329);
  hmac::generate_time_token(local_350,(string *)local_68,(string *)local_328,0x3c,SHA256);
  poVar3 = std::operator<<((ostream *)&std::cout,"Fingerprint = ");
  poVar3 = std::operator<<(poVar3,local_328);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::cout,"Token = ");
  poVar3 = std::operator<<(poVar3,(string *)local_350);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  bVar1 = hmac::is_token_valid
                    ((string *)local_350,(string *)local_68,(string *)local_328,0x3c,SHA256);
  poVar3 = std::operator<<((ostream *)&std::cout,"Token valid (with fingerprint)? = ");
  pcVar4 = "NO";
  if (bVar1) {
    pcVar4 = "YES";
  }
  poVar3 = std::operator<<(poVar3,pcVar4);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_378,"12345678901234567890",(allocator *)((long)&test_time + 7))
  ;
  std::allocator<char>::~allocator((allocator<char> *)((long)&test_time + 7));
  iVar2 = hmac::get_totp_code_at((string *)local_378,0x499602d2,0x1e,8,SHA1);
  poVar3 = std::operator<<((ostream *)&std::cout,"TOTP: ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar2);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  std::operator<<((ostream *)&std::cout,"Expected: 89005924\n\n");
  std::operator<<((ostream *)&std::cout,"\nPress Enter to exit...");
  std::istream::get();
  std::__cxx11::string::~string(local_378);
  std::__cxx11::string::~string((string *)local_350);
  std::__cxx11::string::~string(local_328);
  std::__cxx11::string::~string((string *)local_2d8);
  std::__cxx11::string::~string((string *)local_290);
  std::__cxx11::string::~string((string *)local_248);
  std::__cxx11::string::~string((string *)local_200);
  std::__cxx11::string::~string((string *)local_190);
  std::__cxx11::string::~string((string *)local_148);
  std::__cxx11::string::~string((string *)local_100);
  std::__cxx11::string::~string((string *)local_b8);
  std::__cxx11::string::~string(local_68);
  std::__cxx11::string::~string(local_30);
  return 0;
}

Assistant:

int main() {
    const std::string input = "grape";
    const std::string key = "12345";
    
    // SHA1
    print_section("SHA1");
    std::string sha1_output = hmac_hash::sha1(input);
    std::cout << "sha1('" << input << "') = " << sha1_output << std::endl;
    std::cout << "Expected: bc8a2f8cdedb005b5c787692853709b060db75ff\n\n";

    // SHA256
    print_section("SHA256");
    std::string sha256_output = hmac_hash::sha256(input);
    std::cout << "sha256('" << input << "') = " << sha256_output << std::endl;
    std::cout << "Expected: 0f78fcc486f5315418fbf095e71c0675ee07d318e5ac4d150050cd8e57966496\n\n";

    // SHA512
    print_section("SHA512");
    std::string sha512_output = hmac_hash::sha512(input);
    std::cout << "sha512('" << input << "') = " << sha512_output << std::endl;
    std::cout << "Expected: 9375d1abdb644a01955bccad12e2f5c2bd8a3e226187e548d99c559a99461453b980123746753d07c169c22a5d9cc75cb158f0e8d8c0e713559775b5e1391fc4\n\n";

    // to_hex
    print_section("to_hex");
    std::string hex_output = hmac::to_hex("012345");
    std::cout << "to_hex(\"012345\") = " << hex_output << std::endl << std::endl;

    // HMAC-SHA256
    print_section("HMAC-SHA256");
    std::string hmac_sha256 = hmac::get_hmac(key, input, hmac::TypeHash::SHA256, true);
    std::cout << "HMAC('" << key << "', '" << input << "', SHA256) = " << hmac_sha256 << std::endl;
    std::cout << "Expected: 7632ac2e8ddedaf4b3e7ab195fefd17571c37c970e02e169195a158ef59e53ca\n\n";

    // HMAC-SHA512
    print_section("HMAC-SHA512");
    std::string hmac_sha512 = hmac::get_hmac(key, input, hmac::TypeHash::SHA512, true);
    std::cout << "HMAC('" << key << "', '" << input << "', SHA512) = " << hmac_sha512 << std::endl;
    std::cout << "Expected: c54ddf9647a949d0df925a1c1f8ba1c9d721a671c396fde1062a71f9f7ffae5dc10f6be15be63bb0363d051365e23f890368c54828497b9aef2eb2fc65b633e6\n\n";

    // HMAC-SHA512 uppercase hex
    print_section("HMAC-SHA512 (uppercase)");
    std::string hmac_sha512_upper = hmac::get_hmac(key, input, hmac::TypeHash::SHA512, true, true);
    std::cout << "HMAC('" << key << "', '" << input << "', SHA512, hex=true, upper=true) = " << hmac_sha512_upper << std::endl;

    // HMAC TIME TOKEN
    print_section("HMAC-TIMED TOKEN");
    std::string time_token = hmac::generate_time_token(key, 60);
    std::cout << "Time token (now) = " << time_token << std::endl;
    bool valid = hmac::is_token_valid(time_token, key, 60);
    std::cout << "Token valid? = " << (valid ? "YES" : "NO") << std::endl;

    // HMAC TIME TOKEN + fingerprint
    print_section("HMAC-TIMED TOKEN (with fingerprint)");
    std::string fingerprint = "my-client-unique-id";
    std::string timed_token = hmac::generate_time_token(key, fingerprint, 60);
    std::cout << "Fingerprint = " << fingerprint << std::endl;
    std::cout << "Token = " << timed_token << std::endl;
    bool valid_fp = hmac::is_token_valid(timed_token, key, fingerprint, 60);
    std::cout << "Token valid (with fingerprint)? = " << (valid_fp ? "YES" : "NO") << std::endl;

    // TOTP
    std::string totp_key = "12345678901234567890"; // raw binary string (not base32!)
    uint64_t test_time = 1234567890;
    int code = hmac::get_totp_code_at(totp_key, test_time, 30, 8, hmac::TypeHash::SHA1);
    std::cout << "TOTP: " << code << std::endl;
    std::cout << "Expected: 89005924\n\n";
    
    // Pause before exit
    std::cout << "\nPress Enter to exit...";
    std::cin.get();
    return 0;
}